

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

int ImStb::stb_textedit_paste
              (ImGuiInputTextState *str,STB_TexteditState *state,ImWchar *ctext,int len)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ImWchar *pIVar4;
  
  stb_textedit_clamp(str,state);
  stb_textedit_delete_selection(str,state);
  bVar2 = STB_TEXTEDIT_INSERTCHARS(str,state->cursor,ctext,len);
  if (bVar2) {
    pIVar4 = stb_text_createundo(&state->undostate,state->cursor,0,len);
    uVar3 = (uint)pIVar4;
    state->cursor = state->cursor + len;
    state->has_preferred_x = '\0';
  }
  else {
    uVar1 = (state->undostate).undo_point;
    uVar3 = (uint)uVar1;
    if (uVar1 != 0) {
      uVar3 = uVar1 - 1;
      (state->undostate).undo_point = (short)uVar3;
    }
  }
  return uVar3;
}

Assistant:

static int stb_textedit_paste(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_CHARTYPE const *ctext, int len)
{
   return stb_textedit_paste_internal(str, state, (STB_TEXTEDIT_CHARTYPE *) ctext, len);
}